

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

string * Corrade::Utility::Directory::current_abi_cxx11_(void)

{
  String *other;
  string *in_RDI;
  Optional<Corrade::Containers::String> out;
  Optional<Corrade::Containers::String> local_50;
  string local_30;
  
  Path::currentDirectory();
  if (local_50._set == true) {
    other = Containers::Optional<Corrade::Containers::String>::operator*(&local_50);
    Containers::Implementation::
    StringConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::to(&local_30,other);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      (in_RDI->field_2)._M_allocated_capacity = local_30.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_30.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_30._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity = local_30.field_2._M_allocated_capacity;
    }
    in_RDI->_M_string_length = local_30._M_string_length;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  if ((local_50._set & 1U) != 0) {
    Containers::String::~String((String *)&local_50);
  }
  return in_RDI;
}

Assistant:

std::string current() {
    Containers::Optional<Containers::String> out = Path::currentDirectory();
    return out ? std::string{*out} : std::string{};
}